

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall
IRBuilderAsmJs::BuildInt1Double2
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  RegOpnd *this_00;
  RegOpnd *this_01;
  RegOpnd *this_02;
  undefined4 *puVar3;
  Instr *local_60;
  Instr *instr;
  RegOpnd *dstOpnd;
  RegOpnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegSlot src2RegSlot_local;
  RegSlot src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  this_00 = BuildSrcOpnd(this,src1RegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_00->super_Opnd,ValueType::Float);
  this_01 = BuildSrcOpnd(this,src2RegSlot,TyFloat64);
  IR::Opnd::SetValueType(&this_01->super_Opnd,ValueType::Float);
  this_02 = BuildDstOpnd(this,dstRegSlot,TyInt32);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_02->super_Opnd,valueType);
  local_60 = (Instr *)0x0;
  switch(newOpcode) {
  case CmLt_Db:
    local_60 = IR::Instr::New(CmLt_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                              this->m_func);
    break;
  case CmLe_Db:
    local_60 = IR::Instr::New(CmLe_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                              this->m_func);
    break;
  case CmGt_Db:
    local_60 = IR::Instr::New(CmGt_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                              this->m_func);
    break;
  case CmGe_Db:
    local_60 = IR::Instr::New(CmGe_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                              this->m_func);
    break;
  case CmEq_Db:
    local_60 = IR::Instr::New(CmEq_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd,
                              this->m_func);
    break;
  case CmNe_Db:
    local_60 = IR::Instr::New(CmNeq_A,&this_02->super_Opnd,&this_00->super_Opnd,&this_01->super_Opnd
                              ,this->m_func);
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x94f,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  AddInstr(this,local_60,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildInt1Double2(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot, Js::RegSlot src2RegSlot)
{
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TyFloat64);
    src1Opnd->SetValueType(ValueType::Float);

    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TyFloat64);
    src2Opnd->SetValueType(ValueType::Float);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt32);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = nullptr;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::CmLt_Db:
        instr = IR::Instr::New(Js::OpCode::CmLt_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::CmLe_Db:
        instr = IR::Instr::New(Js::OpCode::CmLe_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::CmGt_Db:
        instr = IR::Instr::New(Js::OpCode::CmGt_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::CmGe_Db:
        instr = IR::Instr::New(Js::OpCode::CmGe_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::CmEq_Db:
        instr = IR::Instr::New(Js::OpCode::CmEq_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    case Js::OpCodeAsmJs::CmNe_Db:
        instr = IR::Instr::New(Js::OpCode::CmNeq_A, dstOpnd, src1Opnd, src2Opnd, m_func);
        break;

    default:
        Assume(UNREACHED);
    }
    AddInstr(instr, offset);
}